

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

void __thiscall
slang::IntervalMap<int,_int,_2U>::insert
          (IntervalMap<int,_int,_2U> *this,int left,int right,int *value,allocator_type *alloc)

{
  bool bVar1;
  uint32_t uVar2;
  IntervalMap<int,_int,_2U> *in_RDI;
  iterator *in_R8;
  iterator it;
  uint32_t i;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  uint32_t in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  bVar1 = isFlat(in_RDI);
  if ((bVar1) && (in_RDI->rootSize != 3)) {
    IntervalMapDetails::NodeImpl<int,_slang::IntervalMapDetails::LeafNode<int,_int,_3U,_true>_>::
    find((NodeImpl<int,_slang::IntervalMapDetails::LeafNode<int,_int,_3U,_true>_> *)
         in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
         (interval<int> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    uVar2 = IntervalMapDetails::LeafNode<int,_int,_3U,_true>::insertFrom
                      ((LeafNode<int,_int,_3U,_true> *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
                       (interval<int> *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),(int *)in_RDI);
    in_RDI->rootSize = uVar2;
  }
  else {
    iterator::iterator((iterator *)in_RDI,(IntervalMap<int,_int,_2U> *)&stack0xffffffffffffff88);
    const_iterator::setToFind
              ((const_iterator *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    iterator::insert(in_R8,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
                     (int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (allocator_type *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                    );
    iterator::~iterator((iterator *)0x829eb6);
  }
  return;
}

Assistant:

void insert(TKey left, TKey right, const TValue& value, allocator_type& alloc) {
        if (isFlat() && rootSize != RootLeaf::Capacity) {
            uint32_t i = rootLeaf.find(rootSize, {left, right});
            rootSize = rootLeaf.insertFrom(i, rootSize, {left, right}, value);
        }
        else {
            iterator it(*this);
            it.setToFind(left, right);
            it.insert(left, right, value, alloc);
        }
    }